

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O3

int Cudd_PrintTwoLiteralClauses(DdManager *dd,DdNode *f,char **names,FILE *fp)

{
  uint uVar1;
  uint *puVar2;
  long *plVar3;
  int iVar4;
  DdTlcInfo *t;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  
  t = Cudd_FindTwoLiteralClauses(dd,f);
  if (fp == (FILE *)0x0) {
    fp = dd->out;
  }
  if (t == (DdTlcInfo *)0x0) {
    iVar4 = 0;
  }
  else {
    puVar2 = t->vars;
    uVar5 = *puVar2;
    uVar1 = puVar2[1];
    if (uVar1 != 0 || uVar5 != 0) {
      plVar3 = t->phases;
      uVar9 = 0;
      do {
        uVar6 = (ulong)uVar5;
        uVar5 = (uint)uVar9;
        if (names == (char **)0x0) {
          if (uVar1 == 0x7fffffff) {
            if ((plVar3 == (long *)0x0) ||
               (pcVar7 = " & ~", ((ulong)plVar3[uVar9 >> 6 & 0x3ffffff] >> (uVar5 & 0x3e) & 1) == 0)
               ) {
              pcVar7 = "\r\n\t ";
            }
            fprintf((FILE *)fp,"%s%d\n",pcVar7 + 3);
          }
          else {
            pcVar7 = " ";
            pcVar8 = " ";
            if (plVar3 != (long *)0x0) {
              pcVar8 = "~";
              pcVar7 = " & ~";
              if (((ulong)plVar3[uVar9 >> 6 & 0x3ffffff] >> (uVar5 & 0x3e) & 1) == 0) {
                pcVar7 = "\r\n\t ";
              }
              pcVar7 = pcVar7 + 3;
              if (((ulong)plVar3[uVar9 >> 6 & 0x3ffffff] >> (uVar9 + 1 & 0x3f) & 1) == 0) {
                pcVar8 = " ";
              }
            }
            fprintf((FILE *)fp,"%s%d | %s%d\n",pcVar7,uVar6,pcVar8);
          }
        }
        else if (uVar1 == 0x7fffffff) {
          if ((plVar3 == (long *)0x0) ||
             (pcVar7 = " & ~", ((ulong)plVar3[uVar9 >> 6 & 0x3ffffff] >> (uVar5 & 0x3e) & 1) == 0))
          {
            pcVar7 = "\r\n\t ";
          }
          fprintf((FILE *)fp,"%s%s\n",pcVar7 + 3,names[uVar6]);
        }
        else {
          pcVar7 = " ";
          pcVar8 = " ";
          if (plVar3 != (long *)0x0) {
            pcVar8 = "~";
            pcVar7 = " & ~";
            if (((ulong)plVar3[uVar9 >> 6 & 0x3ffffff] >> (uVar5 & 0x3e) & 1) == 0) {
              pcVar7 = "\r\n\t ";
            }
            pcVar7 = pcVar7 + 3;
            if (((ulong)plVar3[uVar9 >> 6 & 0x3ffffff] >> (uVar9 + 1 & 0x3f) & 1) == 0) {
              pcVar8 = " ";
            }
          }
          fprintf((FILE *)fp,"%s%s | %s%s\n",pcVar7,names[uVar6],pcVar8,names[uVar1]);
        }
        uVar5 = puVar2[uVar9 + 2];
        uVar1 = puVar2[uVar9 + 3];
        uVar9 = uVar9 + 2;
      } while (uVar1 != 0 || uVar5 != 0);
    }
    Cudd_tlcInfoFree(t);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
Cudd_PrintTwoLiteralClauses(
  DdManager * dd,
  DdNode * f,
  char **names,
  FILE *fp)
{
    DdHalfWord *vars;
    BitVector *phases;
    int i;
    DdTlcInfo *res = Cudd_FindTwoLiteralClauses(dd, f);
    FILE *ifp = fp == NULL ? dd->out : fp;

    if (res == NULL) return(0);
    vars = res->vars;
    phases = res->phases;
    for (i = 0; !sentinelp(vars[i], vars[i+1]); i += 2) {
        if (names != NULL) {
            if (vars[i+1] == CUDD_MAXINDEX) {
                (void) fprintf(ifp, "%s%s\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               names[vars[i]]);
            } else {
                (void) fprintf(ifp, "%s%s | %s%s\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               names[vars[i]],
                               bitVectorRead(phases, i+1) ? "~" : " ",
                               names[vars[i+1]]);
            }
        } else {
            if (vars[i+1] == CUDD_MAXINDEX) {
                (void) fprintf(ifp, "%s%d\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               (int) vars[i]);
            } else {
                (void) fprintf(ifp, "%s%d | %s%d\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               (int) vars[i],
                               bitVectorRead(phases, i+1) ? "~" : " ",
                               (int) vars[i+1]);
            }
        }
    }
    Cudd_tlcInfoFree(res);

    return(1);

}